

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void Am_Visible_By_Fly_Apart_Start_Do_proc(Am_Object *interp)

{
  unsigned_short uVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object local_50;
  undefined1 local_48 [8];
  Am_Value_List new_objs;
  Am_Object owner;
  bool vis;
  undefined1 local_20 [8];
  Am_Value value2;
  Am_Object *interp_local;
  
  value2.value = (anon_union_8_8_ea4c8939_for_value)interp;
  Am_Value::Am_Value((Am_Value *)local_20);
  pAVar2 = Am_Object::Peek(interp,0x182,0);
  Am_Value::operator=((Am_Value *)local_20,pAVar2);
  Am_Value::Valid((Am_Value *)local_20);
  pAVar2 = Am_Object::Get(interp,0x193,0);
  Am_Object::Am_Object((Am_Object *)&new_objs.item,pAVar2);
  break_up_objects((Am_Object *)local_48,interp,(bool)((char)&new_objs + '\b'));
  value = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_48);
  Am_Object::Set(interp,0x82,value,1);
  uVar1 = Am_Value_List::Length((Am_Value_List *)local_48);
  Am_Object::Set(interp,0x10e,(uint)uVar1,1);
  Am_Object::Set(interp,0x169,false,0);
  Am_Object::Am_Object(&local_50,interp);
  Am_Set_Animated_Slots(&local_50);
  Am_Object::~Am_Object(&local_50);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_48);
  Am_Object::~Am_Object((Am_Object *)&new_objs.item);
  Am_Value::~Am_Value((Am_Value *)local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Visible_By_Fly_Apart_Start_Do,
                 (Am_Object interp))
{
  Am_INTER_TRACE_PRINT(interp, "Animator Start of " << interp);

  Am_Value value2;
  value2 = interp.Peek(Am_VALUE_2);
  bool vis = value2.Valid(); //going visible?

  Am_Object owner = interp.Get(Am_OPERATES_ON);
  Am_Value_List new_objs = break_up_objects(interp, owner, vis);
  interp.Set(Am_GRAPHICAL_PARTS, new_objs, Am_OK_IF_NOT_THERE);
  //countdown of number of anims
  interp.Set(Am_WIGGLES, new_objs.Length(), Am_OK_IF_NOT_THERE);

  //whether getting visible or not, be invisible during animation
  interp.Set(Am_VALUE, false);

  // don't register a timer here!
  // the sub-animators will do all the animating, and then call us
  // back when their done

  Am_Set_Animated_Slots(interp);
}